

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::bitmaskI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_local;
  
  bitmask<4,_&wasm::Literal::getLanesI32x4>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitmaskI32x4() const {
  return bitmask<4, &Literal::getLanesI32x4>(*this);
}